

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_repeat_t::Generate(ast_repeat_t *this,ostream *output,int pc)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  int repeat_loc;
  int pc_local;
  ostream *output_local;
  ast_repeat_t *this_local;
  
  (this->super_ast_loop_t).end_loc_pos = pc;
  poVar3 = std::operator<<(output,": __repeat_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pc);
  poVar3 = std::operator<<(poVar3,"__");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar1 = ast_t::Generate(this->loop,output,pc);
  iVar2 = (*this->condition->_vptr_ast_item_t[2])(this->condition,output,(ulong)uVar1);
  poVar3 = std::operator<<(output,"jz __repeat_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pc);
  poVar3 = std::operator<<(poVar3,"__");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(output,": __end_repeat_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pc);
  poVar3 = std::operator<<(poVar3,"__");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return iVar2 + 1;
}

Assistant:

int ast_repeat_t::Generate(std::ostream& output, int pc) const {

    int repeat_loc = pc;

    this->end_loc_pos = repeat_loc;
    output << ": __repeat_" << repeat_loc << "__" << std::endl;
    pc = this->loop->Generate(output, pc);

    pc = this->condition->Generate(output, pc);
    output << "jz __repeat_" << repeat_loc << "__" << std::endl;
    ++pc;

    output << ": __end_repeat_" << repeat_loc << "__" << std::endl;

    return pc;
  }